

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O0

void __thiscall sc_core::sc_module::elaboration_done(sc_module *this,bool *error_)

{
  ostream *poVar1;
  char *pcVar2;
  byte *in_RSI;
  long *in_RDI;
  hierarchy_scope scope;
  stringstream msg;
  sc_module *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [12];
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  sc_severity in_stack_fffffffffffffea4;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"module \'");
    pcVar2 = sc_object::name((sc_object *)0x2adecd);
    in_stack_fffffffffffffe10 = std::operator<<(poVar1,pcVar2);
    std::operator<<(in_stack_fffffffffffffe10,"\'");
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffe08 = (sc_module *)std::__cxx11::string::c_str();
    sc_report_handler::report
              (in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    std::__cxx11::string::~string(local_1c8);
    if ((*in_RSI & 1) != 0) {
      sc_report_handler::report
                (in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    }
    *in_RSI = 1;
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  sc_object::hierarchy_scope::hierarchy_scope
            ((hierarchy_scope *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  (**(code **)(*in_RDI + 0x80))();
  sc_object::hierarchy_scope::~hierarchy_scope((hierarchy_scope *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

void
sc_module::elaboration_done( bool& error_ )
{
    if( ! m_end_module_called ) {
        std::stringstream msg;
        msg << "module '" << name() << "'";
        SC_REPORT_WARNING( SC_ID_END_MODULE_NOT_CALLED_, msg.str().c_str() );
        if( error_ ) {
            SC_REPORT_WARNING( SC_ID_HIER_NAME_INCORRECT_, 0 );
        }
        error_ = true;
    }
    hierarchy_scope scope(this);
    end_of_elaboration();
}